

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

void udp_pipe_schedule(udp_pipe *p)

{
  udp_ep *puVar1;
  ulong uVar2;
  ulong uVar3;
  
  puVar1 = p->ep;
  uVar2 = p->expire;
  if (uVar2 < puVar1->next_wake) {
    puVar1->next_wake = uVar2;
    uVar3 = p->next_wake;
    if (uVar2 <= uVar3) goto LAB_0012c490;
  }
  else {
    uVar3 = p->next_wake;
    if (puVar1->next_wake <= uVar3) {
      return;
    }
  }
  puVar1->next_wake = uVar3;
LAB_0012c490:
  nni_aio_abort(&puVar1->timeaio,NNG_EINTR);
  return;
}

Assistant:

static void
udp_pipe_schedule(udp_pipe *p)
{
	udp_ep *ep      = p->ep;
	bool    changed = false;
	if (p->expire < ep->next_wake) {
		ep->next_wake = p->expire;
		changed       = true;
	}
	if (p->next_wake < ep->next_wake) {
		ep->next_wake = p->next_wake;
		changed       = true;
	}
	if (changed) {
		nni_aio_abort(&ep->timeaio, NNG_EINTR);
	}
}